

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConsumer.cpp
# Opt level: O0

optional<Vault::AuthenticationResponse> *
Vault::HttpConsumer::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,Client *client,Url *url,
          NoArgJsonProducer *jsonProducer)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  reference pvVar3;
  undefined4 extraout_var_00;
  HttpResponse *pHVar4;
  AuthenticationResponse local_218;
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  local_1d8;
  input_adapter local_1b8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [8];
  Token token;
  HttpResponseBodyString body;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Tiny<Vault::NamespaceDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined1 local_78 [8];
  optional<Vault::HttpResponse> response;
  NoArgJsonProducer *jsonProducer_local;
  Url *url_local;
  Client *client_local;
  
  response.super__Optional_base<Vault::HttpResponse,_false,_false>._M_payload.
  super__Optional_payload<Vault::HttpResponse,_true,_false,_false>.
  super__Optional_payload_base<Vault::HttpResponse>._72_8_ = jsonProducer;
  iVar2 = (*client->_vptr_Client[10])();
  (*client->_vptr_Client[8])(&local_98);
  (*client->_vptr_Client[9])(&local_b8);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::operator()(&local_e8,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)response.super__Optional_base<Vault::HttpResponse,_false,_false>._M_payload.
                  super__Optional_payload<Vault::HttpResponse,_true,_false,_false>.
                  super__Optional_payload_base<Vault::HttpResponse>._72_8_);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
            (local_78,(long *)CONCAT44(extraout_var,iVar2),url,&local_98,&local_b8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  Tiny<Vault::NamespaceDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_b8);
  Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_98);
  std::optional<Vault::HttpResponse>::optional
            ((optional<Vault::HttpResponse> *)((long)&body.value_.field_2 + 8),
             (optional<Vault::HttpResponse> *)local_78);
  bVar1 = HttpClient::is_success((optional<Vault::HttpResponse> *)((long)&body.value_.field_2 + 8));
  std::optional<Vault::HttpResponse>::~optional
            ((optional<Vault::HttpResponse> *)((long)&body.value_.field_2 + 8));
  if (bVar1) {
    pHVar4 = std::optional<Vault::HttpResponse>::value((optional<Vault::HttpResponse> *)local_78);
    Tiny<Vault::HttpResponseBodyStringDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Tiny((Tiny<Vault::HttpResponseBodyStringDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&token.value_.field_2 + 8),&pHVar4->body);
    c = Tiny<Vault::HttpResponseBodyStringDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::value((Tiny<Vault::HttpResponseBodyStringDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&token.value_.field_2 + 8));
    nlohmann::detail::input_adapter::
    input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_1b8,c);
    std::
    function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
    ::function(&local_1d8,(nullptr_t)0x0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::parse(&local_1a8,&local_1b8,&local_1d8,true);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_1a8,"auth");
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar3,"client_token");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_198,pvVar3);
    Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Tiny((Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_178,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_1a8);
    std::
    function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
    ::~function(&local_1d8);
    nlohmann::detail::input_adapter::~input_adapter(&local_1b8);
    Tiny<Vault::HttpResponseBodyStringDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Tiny(&local_218.rawResponse,
           (Tiny<Vault::HttpResponseBodyStringDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&token.value_.field_2 + 8));
    Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Tiny(&local_218.token,
           (Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_178);
    std::optional<Vault::AuthenticationResponse>::optional<Vault::AuthenticationResponse,_true>
              (__return_storage_ptr__,&local_218);
    AuthenticationResponse::~AuthenticationResponse(&local_218);
    Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Tiny((Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_178);
    Tiny<Vault::HttpResponseBodyStringDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Tiny((Tiny<Vault::HttpResponseBodyStringDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&token.value_.field_2 + 8));
  }
  else {
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_78);
    if (bVar1) {
      iVar2 = (*client->_vptr_Client[10])();
      pHVar4 = std::optional<Vault::HttpResponse>::value((optional<Vault::HttpResponse> *)local_78);
      HttpClient::handleResponseError((HttpClient *)CONCAT44(extraout_var_00,iVar2),pHVar4);
    }
    std::optional<Vault::AuthenticationResponse>::optional(__return_storage_ptr__);
  }
  std::optional<Vault::HttpResponse>::~optional((optional<Vault::HttpResponse> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
Vault::HttpConsumer::authenticate(const Vault::Client &client,
                                  const Vault::Url &url,
                                  const NoArgJsonProducer &jsonProducer) {
  auto response = client.getHttpClient().post(
      url, client.getToken(), client.getNamespace(), jsonProducer());

  if (HttpClient::is_success(response)) {
    auto body = Vault::HttpResponseBodyString{response.value().body};
    auto token = Vault::Token{
        nlohmann::json::parse(body.value())["auth"]["client_token"]};

    return AuthenticationResponse{body, token};
  }

  if (response) {
    client.getHttpClient().handleResponseError(response.value());
  }

  return std::nullopt;
}